

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

Type __thiscall camp::Function::argType(Function *this,size_t index)

{
  size_type sVar1;
  OutOfRange *__return_storage_ptr__;
  size_type size;
  const_reference pvVar2;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  OutOfRange local_60;
  size_type local_18;
  size_t index_local;
  Function *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  sVar1 = std::vector<camp::Type,_std::allocator<camp::Type>_>::size(&this->m_argTypes);
  if (sVar1 <= index) {
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    sVar1 = local_18;
    size = std::vector<camp::Type,_std::allocator<camp::Type>_>::size(&this->m_argTypes);
    OutOfRange::OutOfRange(&local_60,sVar1,size);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"Type camp::Function::argType(std::size_t) const",&local_b9);
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr__,&local_60,(string *)local_90,0x42,(string *)local_b8);
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,OutOfRange::~OutOfRange);
  }
  pvVar2 = std::vector<camp::Type,_std::allocator<camp::Type>_>::operator[]
                     (&this->m_argTypes,local_18);
  return *pvVar2;
}

Assistant:

Type Function::argType(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_argTypes.size())
        CAMP_ERROR(OutOfRange(index, m_argTypes.size()));

    return m_argTypes[index];
}